

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_iinq.c
# Opt level: O0

void iinq_test_create_open_source_intint(planck_unit_test_t *tc)

{
  ion_value_size_t value_size;
  ion_key_size_t key_size;
  ion_key_type_t key_type;
  char *schema_file_name;
  planck_unit_test_t *tc_local;
  
  iinq_test_create_open_source(tc,"intint.inq",key_type_numeric_signed,4,4);
  return;
}

Assistant:

void
iinq_test_create_open_source_intint(
	planck_unit_test_t *tc
) {
	char				*schema_file_name;
	ion_key_type_t		key_type;
	ion_key_size_t		key_size;
	ion_value_size_t	value_size;

	schema_file_name	= "intint.inq";
	key_type			= key_type_numeric_signed;
	key_size			= sizeof(int);
	value_size			= sizeof(int);

	iinq_test_create_open_source(tc, schema_file_name, key_type, key_size, value_size);
}